

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O2

void TestSingle_IsSpecial(void)

{
  bool in_CL;
  
  CheckHelper((char *)0xab,0xc1c693,(char *)0x1,in_CL);
  CheckHelper((char *)0xac,0xc1c6ba,(char *)0x1,in_CL);
  CheckHelper((char *)0xad,0xc1c6e2,(char *)0x1,in_CL);
  CheckHelper((char *)0xaf,0xc1c704,(char *)0x1,in_CL);
  CheckHelper((char *)0xb1,0xc1c71d,(char *)0x1,in_CL);
  CheckHelper((char *)0xb2,0xc1c73b,(char *)0x1,in_CL);
  CheckHelper((char *)0xb4,0xc1c75a,(char *)0x1,in_CL);
  CheckHelper((char *)0xb5,0xc1c774,(char *)0x1,in_CL);
  CheckHelper((char *)0xb6,0xc1c78f,(char *)0x1,in_CL);
  CheckHelper((char *)0xb7,0xc1c7a9,(char *)0x1,in_CL);
  CheckHelper((char *)0xb8,0xc1c7c4,(char *)0x1,in_CL);
  CheckHelper((char *)0xb9,0xc1c7e4,(char *)0x1,in_CL);
  CheckHelper((char *)0xba,0xc1c805,(char *)0x1,in_CL);
  CheckHelper((char *)0xbb,0xc1c820,(char *)0x1,in_CL);
  CheckHelper((char *)0xbc,0xc1c83c,(char *)0x1,in_CL);
  CheckHelper((char *)0xbd,0xc1c85b,(char *)0x1,in_CL);
  return;
}

Assistant:

TEST(Single_IsSpecial) {
  CHECK(Single(Single::Infinity()).IsSpecial());
  CHECK(Single(-Single::Infinity()).IsSpecial());
  CHECK(Single(Single::NaN()).IsSpecial());
  uint32_t bits = 0xFFF12345;
  CHECK(Single(bits).IsSpecial());
  // Denormals are not special:
  CHECK(!Single(1.4e-45f).IsSpecial());
  CHECK(!Single(-1.4e-45f).IsSpecial());
  // And some random numbers:
  CHECK(!Single(0.0f).IsSpecial());
  CHECK(!Single(-0.0f).IsSpecial());
  CHECK(!Single(1.0f).IsSpecial());
  CHECK(!Single(-1.0f).IsSpecial());
  CHECK(!Single(1000000.0f).IsSpecial());
  CHECK(!Single(-1000000.0f).IsSpecial());
  CHECK(!Single(1e23f).IsSpecial());
  CHECK(!Single(-1e23f).IsSpecial());
  CHECK(!Single(1.18e-38f).IsSpecial());
  CHECK(!Single(-1.18e-38f).IsSpecial());
}